

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator|
          (my_set<unsigned_long> *__return_storage_ptr__,my_set<unsigned_long> *this,
          my_set<unsigned_long> *b)

{
  size_t sVar1;
  size_t sVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  unsigned_long *local_78;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_70;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  unsigned_long *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  iterator dend;
  my_set<unsigned_long> *b_local;
  my_set<unsigned_long> *this_local;
  my_set<unsigned_long> *d;
  
  my_set(__return_storage_ptr__,10);
  sVar1 = size(this);
  sVar2 = size(b);
  dend._M_current = (unsigned_long *)0x0;
  resize(__return_storage_ptr__,sVar1 + sVar2,(unsigned_long *)&dend);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  __normal_iterator(&local_48);
  local_58._M_current = (unsigned_long *)begin(this);
  local_60._M_current = (unsigned_long *)end(this);
  local_68._M_current = (unsigned_long *)begin(b);
  local_70._M_current = (unsigned_long *)end(b);
  local_78 = (unsigned_long *)_begin(__return_storage_ptr__);
  local_50 = (unsigned_long *)
             std::
             set_union<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (local_58,local_60,local_68,local_70,
                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_78);
  local_48 = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_50;
  local_80._M_current = (unsigned_long *)begin(__return_storage_ptr__);
  sVar1 = __gnu_cxx::operator-(&local_48,&local_80);
  (__return_storage_ptr__->super_my_vector<unsigned_long>).m_n = sVar1;
  update(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

my_set<T> my_set<T>::operator|(const my_set<T>& b) const {
	my_set<T> d;
	d.resize(size() + b.size());                         // reserve enough space
	typename my_set<T>::iterator dend;
	dend = std::set_union(begin(), end(), b.begin(), b.end(), d._begin()); // use stl set function
	d.m_n = dend - d.begin();
	d.update();
	return d;
}